

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_functionApplyDirectVia
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t functionOperand,
               size_t argumentCount,int16_t *argumentOperands,void *calledFunctionPointer)

{
  ulong local_38;
  size_t i;
  void *calledFunctionPointer_local;
  int16_t *argumentOperands_local;
  size_t argumentCount_local;
  int16_t functionOperand_local;
  int16_t resultOperand_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  for (local_38 = 0; local_38 < argumentCount; local_38 = local_38 + 1) {
    sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[local_38],(int32_t)local_38);
  }
  sysbvm_jit_x86_jitLoadContextInRegister(jit,SYSBVM_X86_64_ARG0);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionOperand);
  sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_64_ARG2,(int32_t)argumentCount);
  sysbvm_jit_x86_leaRegisterWithOffset
            (jit,SYSBVM_X86_64_ARG3,SYSBVM_X86_EBP,jit->callArgumentVectorOffset);
  sysbvm_jit_x86_call(jit,calledFunctionPointer);
  sysbvm_jit_moveRegisterToOperand(jit,resultOperand,SYSBVM_X86_64_CALL_SHADOW_SPACE);
  return;
}

Assistant:

static void sysbvm_jit_functionApplyDirectVia(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t functionOperand, size_t argumentCount, int16_t *argumentOperands, void *calledFunctionPointer)
{
    // Move the arguments into the call vector.
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_jit_moveOperandToCallArgumentVector(jit, argumentOperands[i], (int32_t)i);

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, functionOperand);
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG2, (int32_t)argumentCount);
    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_64_ARG3, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);

    sysbvm_jit_x86_call(jit, calledFunctionPointer);

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}